

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  GCstr *str;
  TValue *pTVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  GCtab *t_00;
  char *pcVar10;
  bool bVar11;
  TValue *local_1b0;
  uint local_1a4;
  uint local_1a0;
  int local_198;
  char *local_190;
  BCLine local_184;
  BCLine line;
  MSize szl;
  MSize i;
  int sz;
  BCLine first;
  void *lineinfo;
  GCproto *pt_2;
  GCtab *t;
  GCproto *pt_1;
  GCstr *name;
  BCLine firstline;
  GCproto *pt;
  uint32_t size;
  uint32_t offset;
  TValue *func;
  GCfunc *fn;
  TValue *nextframe;
  TValue *frame;
  int opt_L;
  int opt_f;
  int ext_local;
  lj_Debug *ar_local;
  char *what_local;
  lua_State *L_local;
  
  bVar7 = false;
  bVar8 = false;
  nextframe = (TValue *)0x0;
  fn = (GCfunc *)0x0;
  if (*what == '>') {
    if ((int)L->top[-1].field_4.it >> 0xf != -9) {
      return 0;
    }
    uVar3 = L->top[-1].u64;
    L->top = L->top + -1;
    ar_local = (lj_Debug *)(what + 1);
  }
  else {
    uVar9 = (uint)ar->i_ci >> 0x10;
    nextframe = (TValue *)((L->stack).ptr64 + (ulong)(ar->i_ci & 0xffff) * 8);
    if (uVar9 != 0) {
      fn = (GCfunc *)(nextframe + uVar9);
    }
    uVar3 = nextframe[-1].u64;
    ar_local = (lj_Debug *)what;
  }
  func = (TValue *)(uVar3 & 0x7fffffffffff);
  do {
    if ((char)ar_local->event == '\0') {
      if (bVar7) {
        L->top->u64 = (ulong)func | 0xfffb800000000000;
        pTVar5 = L->top;
        L->top = pTVar5 + 1;
        if ((TValue *)(L->maxstack).ptr64 <= pTVar5 + 1) {
          lj_state_growstack1(L);
        }
      }
      if (bVar8) {
        if (*(char *)((long)func + 10) == '\0') {
          t_00 = lj_tab_new(L,0,0);
          uVar4 = func[4].u64;
          lVar6 = *(long *)(uVar4 - 0x18);
          if (lVar6 != 0) {
            iVar1 = *(int *)(uVar4 - 0x20);
            if (*(int *)(uVar4 - 0x1c) < 0x100) {
              local_198 = 1;
            }
            else {
              local_198 = 4;
              if (*(int *)(uVar4 - 0x1c) < 0x10000) {
                local_198 = 2;
              }
            }
            iVar2 = *(int *)(uVar4 - 0x5c);
            for (line = 0; (uint)line < iVar2 - 1U; line = line + 1) {
              if (local_198 == 1) {
                local_1a0 = (uint)*(byte *)(lVar6 + (ulong)(uint)line);
              }
              else {
                if (local_198 == 2) {
                  local_1a4 = (uint)*(ushort *)(lVar6 + (ulong)(uint)line * 2);
                }
                else {
                  local_1a4 = *(uint *)(lVar6 + (ulong)(uint)line * 4);
                }
                local_1a0 = local_1a4;
              }
              local_1a0 = iVar1 + local_1a0;
              if (local_1a0 < t_00->asize) {
                local_1b0 = (TValue *)((t_00->array).ptr64 + (long)(int)local_1a0 * 8);
              }
              else {
                local_1b0 = lj_tab_setinth(L,t_00,local_1a0);
              }
              local_1b0->u64 = 0xfffeffffffffffff;
            }
          }
          L->top->u64 = (ulong)t_00 | 0xfffa000000000000;
        }
        else {
          L->top->u64 = 0xffffffffffffffff;
        }
        pTVar5 = L->top;
        L->top = pTVar5 + 1;
        if ((TValue *)(L->maxstack).ptr64 <= pTVar5 + 1) {
          lj_state_growstack1(L);
        }
      }
      return 1;
    }
    if ((char)ar_local->event == 'S') {
      if (*(char *)((long)func + 10) == '\0') {
        uVar4 = func[4].u64;
        iVar1 = *(int *)(uVar4 - 0x20);
        str = *(GCstr **)(uVar4 - 0x28);
        ar->source = (char *)(str + 1);
        lj_debug_shortname(ar->short_src,str,*(BCLine *)(uVar4 - 0x20));
        ar->linedefined = iVar1;
        ar->lastlinedefined = iVar1 + *(int *)(uVar4 - 0x1c);
        bVar11 = true;
        if (iVar1 == 0) {
          bVar11 = *(int *)(uVar4 - 0x1c) == 0;
        }
        pcVar10 = "main";
        if (bVar11) {
          pcVar10 = "Lua";
        }
        ar->what = pcVar10;
      }
      else {
        ar->source = "=[C]";
        builtin_strncpy(ar->short_src,"[C]",4);
        ar->linedefined = -1;
        ar->lastlinedefined = -1;
        ar->what = "C";
      }
    }
    else if ((char)ar_local->event == 'l') {
      if (nextframe == (TValue *)0x0) {
        local_184 = -1;
      }
      else {
        local_184 = debug_frameline(L,(GCfunc *)func,(cTValue *)fn);
      }
      ar->currentline = local_184;
    }
    else if ((char)ar_local->event == 'u') {
      ar->nups = (uint)*(byte *)((long)func + 0xb);
      if (ext != 0) {
        if (*(char *)((long)func + 10) == '\0') {
          uVar4 = func[4].u64;
          ar->nparams = (uint)*(byte *)(uVar4 - 0x5e);
          ar->isvararg = (uint)((*(byte *)(uVar4 - 0x2b) & 2) != 0);
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
    else if ((char)ar_local->event == 'n') {
      if (nextframe == (TValue *)0x0) {
        local_190 = (char *)0x0;
      }
      else {
        local_190 = lj_debug_funcname(L,nextframe,&ar->name);
      }
      ar->namewhat = local_190;
      if (ar->namewhat == (char *)0x0) {
        ar->namewhat = "";
        ar->name = (char *)0x0;
      }
    }
    else if ((char)ar_local->event == 'f') {
      bVar7 = true;
    }
    else {
      if ((char)ar_local->event != 'L') {
        return 0;
      }
      bVar8 = true;
    }
    ar_local = (lj_Debug *)((long)&ar_local->event + 1);
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    if (!tvisfunc(func)) return 0;
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lj_assertL(offset != 0, "bad frame offset");
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lj_assertL(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)),
	       "broken frame chain");
    fn = frame_func(frame);
    lj_assertL(fn->c.gct == ~LJ_TFUNC, "bad frame function");
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name, pt->firstline);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}